

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_striped_sse41_128_16.c
# Opt level: O3

parasail_result_t *
parasail_nw_rowcol_striped_profile_sse41_128_16
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  ushort *puVar1;
  short *psVar2;
  uint uVar3;
  void *pvVar4;
  parasail_matrix_t *ppVar5;
  int *piVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  int iVar28;
  int iVar29;
  parasail_result_t *ppVar30;
  __m128i *ptr;
  __m128i *palVar31;
  __m128i *ptr_00;
  int16_t *ptr_01;
  int iVar32;
  int iVar33;
  long lVar34;
  long lVar35;
  int iVar36;
  ulong uVar37;
  int32_t segNum;
  uint uVar38;
  long lVar39;
  undefined2 uVar40;
  ulong uVar41;
  long lVar42;
  __m128i *ptr_02;
  int iVar43;
  undefined4 uVar44;
  undefined4 uVar45;
  undefined4 uVar46;
  undefined4 uVar47;
  int iVar48;
  ulong uVar49;
  ulong uVar50;
  int iVar55;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  int iVar54;
  int iVar57;
  undefined1 auVar53 [16];
  ulong uVar56;
  short sVar58;
  short sVar60;
  short sVar61;
  short sVar62;
  short sVar63;
  short sVar64;
  short sVar65;
  short sVar66;
  undefined1 auVar59 [16];
  short sVar67;
  short sVar68;
  undefined1 auVar69 [16];
  ushort uVar70;
  ushort uVar71;
  ushort uVar72;
  ushort uVar73;
  ushort uVar74;
  ushort uVar75;
  ushort uVar76;
  ushort uVar77;
  undefined1 auVar78 [16];
  ushort uVar79;
  ushort uVar83;
  ushort uVar84;
  ushort uVar85;
  ushort uVar86;
  ushort uVar87;
  ushort uVar88;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  ushort uVar90;
  undefined1 auVar82 [16];
  undefined1 in_XMM8 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 in_XMM10 [16];
  undefined1 auVar95 [16];
  undefined1 in_XMM13 [16];
  undefined1 auVar96 [16];
  undefined1 in_XMM14 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  __m128i_16_t e;
  __m128i_16_t h;
  ushort local_68;
  ushort uStack_66;
  longlong local_58;
  longlong lStack_50;
  longlong local_48;
  longlong lStack_40;
  short sVar89;
  short sVar91;
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_nw_rowcol_striped_profile_sse41_128_16_cold_8();
  }
  else {
    pvVar4 = (profile->profile16).score;
    if (pvVar4 == (void *)0x0) {
      parasail_nw_rowcol_striped_profile_sse41_128_16_cold_7();
    }
    else {
      ppVar5 = profile->matrix;
      if (ppVar5 == (parasail_matrix_t *)0x0) {
        parasail_nw_rowcol_striped_profile_sse41_128_16_cold_6();
      }
      else {
        uVar3 = profile->s1Len;
        if ((int)uVar3 < 1) {
          parasail_nw_rowcol_striped_profile_sse41_128_16_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_nw_rowcol_striped_profile_sse41_128_16_cold_4();
        }
        else if (s2Len < 1) {
          parasail_nw_rowcol_striped_profile_sse41_128_16_cold_3();
        }
        else if (open < 0) {
          parasail_nw_rowcol_striped_profile_sse41_128_16_cold_2();
        }
        else if (gap < 0) {
          parasail_nw_rowcol_striped_profile_sse41_128_16_cold_1();
        }
        else {
          uVar38 = uVar3 - 1;
          uVar41 = (ulong)uVar3 + 7 >> 3;
          uVar50 = (ulong)uVar38 % uVar41;
          iVar29 = (int)(uVar38 / uVar41);
          iVar43 = -open;
          iVar33 = ppVar5->min;
          iVar36 = -iVar33;
          if (iVar33 != iVar43 && SBORROW4(iVar33,iVar43) == iVar33 + open < 0) {
            iVar36 = open;
          }
          iVar28 = ppVar5->max;
          ppVar30 = parasail_result_new_rowcol1((uint)((ulong)uVar3 + 7) & 0x7ffffff8,s2Len);
          if (ppVar30 != (parasail_result_t *)0x0) {
            ppVar30->flag = ppVar30->flag | 0x8240801;
            ptr = parasail_memalign___m128i(0x10,uVar41);
            palVar31 = parasail_memalign___m128i(0x10,uVar41);
            ptr_00 = parasail_memalign___m128i(0x10,uVar41);
            ptr_01 = parasail_memalign_int16_t(0x10,(ulong)(s2Len + 1));
            if ((ptr_01 != (int16_t *)0x0 && ptr_00 != (__m128i *)0x0) &&
                (palVar31 != (__m128i *)0x0 && ptr != (__m128i *)0x0)) {
              iVar32 = s2Len + -1;
              auVar51 = pshuflw(ZEXT416((uint)open),ZEXT416((uint)open),0);
              uVar44 = auVar51._0_4_;
              auVar51 = pshuflw(auVar51,ZEXT416((uint)gap),0);
              uVar45 = auVar51._0_4_;
              auVar51 = pshuflw(ZEXT416(iVar36 - 0x7fff),ZEXT416(iVar36 - 0x7fff),0);
              uVar46 = auVar51._0_4_;
              auVar52 = ZEXT416(CONCAT22((short)((uint)iVar33 >> 0x10),0x7ffe - (short)iVar28));
              auVar52 = pshuflw(auVar52,auVar52,0);
              lVar35 = (long)iVar43;
              uVar37 = 0;
              do {
                lVar39 = 0;
                lVar34 = lVar35;
                do {
                  uVar40 = 0x8000;
                  if (-0x8000 < lVar34) {
                    uVar40 = (undefined2)lVar34;
                  }
                  *(undefined2 *)((long)&local_48 + lVar39 * 2) = uVar40;
                  lVar42 = lVar34 - (ulong)(uint)open;
                  if (lVar42 < -0x7fff) {
                    lVar42 = -0x8000;
                  }
                  *(short *)((long)&local_58 + lVar39 * 2) = (short)lVar42;
                  lVar39 = lVar39 + 1;
                  lVar34 = lVar34 - uVar41 * (uint)gap;
                } while (lVar39 != 8);
                ptr[uVar37][0] = local_48;
                ptr[uVar37][1] = lStack_40;
                ptr_00[uVar37][0] = local_58;
                ptr_00[uVar37][1] = lStack_50;
                uVar37 = uVar37 + 1;
                lVar35 = lVar35 - (ulong)(uint)gap;
              } while (uVar37 != uVar41);
              *ptr_01 = 0;
              auVar27 = _DAT_00906ca0;
              lVar35 = (ulong)(uint)s2Len - 1;
              auVar69._8_4_ = (int)lVar35;
              auVar69._0_8_ = lVar35;
              auVar69._12_4_ = (int)((ulong)lVar35 >> 0x20);
              auVar78._4_4_ = gap;
              auVar78._0_4_ = gap;
              auVar78._8_4_ = gap;
              auVar78._12_4_ = gap;
              iVar33 = -gap;
              iVar36 = 0;
              auVar95 = pmovsxbq(in_XMM10,0x100);
              auVar69 = auVar69 ^ _DAT_00906ca0;
              auVar96 = pmovsxbd(in_XMM13,0x7060504);
              auVar97 = pmovsxwd(in_XMM14,0x8000800080008000);
              uVar37 = 0;
              do {
                uVar47 = (undefined4)uVar37;
                auVar80._8_4_ = uVar47;
                auVar80._0_8_ = uVar37;
                auVar80._12_4_ = (int)(uVar37 >> 0x20);
                auVar98 = (auVar80 | auVar95) ^ auVar27;
                lVar35 = auVar69._0_8_;
                auVar99._0_8_ = -(ulong)(lVar35 < auVar98._0_8_);
                lVar34 = auVar69._8_8_;
                auVar99._8_8_ = -(ulong)(lVar34 < auVar98._8_8_);
                auVar92 = pshuflw(in_XMM8,auVar99,0xe8);
                auVar98._8_4_ = 0xffffffff;
                auVar98._0_8_ = 0xffffffffffffffff;
                auVar98._12_4_ = 0xffffffff;
                auVar98 = packssdw(auVar92 ^ auVar98,auVar92 ^ auVar98);
                auVar92._4_4_ = iVar33;
                auVar92._0_4_ = iVar43;
                auVar92._8_8_ = 0;
                iVar48 = iVar43 - iVar36;
                iVar54 = iVar33 - open;
                iVar55 = iVar43 - (gap * 2 + iVar36);
                iVar57 = iVar43 - (gap * 3 + iVar36);
                iVar28 = auVar97._0_4_;
                iVar13 = auVar97._4_4_;
                iVar14 = auVar97._8_4_;
                iVar15 = auVar97._12_4_;
                if ((auVar98 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_01[uVar37 + 1] =
                       (ushort)(iVar48 < iVar28) * auVar97._0_2_ |
                       (ushort)(iVar48 >= iVar28) * (short)iVar48;
                }
                auVar99 = packssdw(auVar99,auVar99);
                auVar20._8_4_ = 0xffffffff;
                auVar20._0_8_ = 0xffffffffffffffff;
                auVar20._12_4_ = 0xffffffff;
                auVar99 = packssdw(auVar99 ^ auVar20,auVar99 ^ auVar20);
                if ((auVar99 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                  ptr_01[uVar37 + 2] =
                       (ushort)(iVar54 < iVar13) * auVar97._4_2_ |
                       (ushort)(iVar54 >= iVar13) * (short)iVar54;
                }
                auVar99 = (auVar80 | _DAT_00903a80) ^ auVar27;
                auVar100._0_8_ = -(ulong)(lVar35 < auVar99._0_8_);
                auVar100._8_8_ = -(ulong)(lVar34 < auVar99._8_8_);
                auVar98 = packssdw(auVar98,auVar100);
                auVar21._8_4_ = 0xffffffff;
                auVar21._0_8_ = 0xffffffffffffffff;
                auVar21._12_4_ = 0xffffffff;
                auVar98 = packssdw(auVar98 ^ auVar21,auVar98 ^ auVar21);
                if ((auVar98 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                  ptr_01[uVar37 + 3] =
                       (ushort)(iVar55 < iVar14) * auVar97._8_2_ |
                       (ushort)(iVar55 >= iVar14) * (short)iVar55;
                }
                auVar98 = pshufhw(auVar98,auVar100,0x84);
                auVar22._8_4_ = 0xffffffff;
                auVar22._0_8_ = 0xffffffffffffffff;
                auVar22._12_4_ = 0xffffffff;
                auVar98 = packssdw(auVar98 ^ auVar22,auVar98 ^ auVar22);
                if ((auVar98 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                  ptr_01[uVar37 + 4] =
                       (ushort)(iVar57 < iVar15) * auVar97._12_2_ |
                       (ushort)(iVar57 >= iVar15) * (short)iVar57;
                }
                auVar93._4_4_ = uVar47;
                auVar93._0_4_ = uVar47;
                auVar93._8_4_ = uVar47;
                auVar93._12_4_ = uVar47;
                in_XMM8 = pmulld(auVar93 | auVar96,auVar78);
                iVar48 = iVar43 - in_XMM8._0_4_;
                iVar54 = iVar43 - in_XMM8._4_4_;
                iVar55 = iVar43 - in_XMM8._8_4_;
                iVar57 = iVar43 - in_XMM8._12_4_;
                auVar98 = (auVar80 | _DAT_00903ad0) ^ auVar27;
                auVar101._0_8_ = -(ulong)(lVar35 < auVar98._0_8_);
                auVar101._8_8_ = -(ulong)(lVar34 < auVar98._8_8_);
                auVar98 = pshuflw(auVar92,auVar101,0xe8);
                auVar23._8_4_ = 0xffffffff;
                auVar23._0_8_ = 0xffffffffffffffff;
                auVar23._12_4_ = 0xffffffff;
                auVar98 = packssdw(auVar98 ^ auVar23,auVar98 ^ auVar23);
                if ((auVar98 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_01[uVar37 + 5] =
                       (ushort)(iVar48 < iVar28) * auVar97._0_2_ |
                       (ushort)(iVar48 >= iVar28) * (short)iVar48;
                }
                auVar92 = packssdw(auVar101,auVar101);
                auVar24._8_4_ = 0xffffffff;
                auVar24._0_8_ = 0xffffffffffffffff;
                auVar24._12_4_ = 0xffffffff;
                auVar98 = packssdw(auVar98,auVar92 ^ auVar24);
                if ((auVar98 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                  ptr_01[uVar37 + 6] =
                       (ushort)(iVar54 < iVar13) * auVar97._4_2_ |
                       (ushort)(iVar54 >= iVar13) * (short)iVar54;
                }
                auVar92 = (auVar80 | _DAT_00903ac0) ^ auVar27;
                auVar81._0_8_ = -(ulong)(lVar35 < auVar92._0_8_);
                auVar81._8_8_ = -(ulong)(lVar34 < auVar92._8_8_);
                auVar98 = packssdw(auVar98,auVar81);
                auVar25._8_4_ = 0xffffffff;
                auVar25._0_8_ = 0xffffffffffffffff;
                auVar25._12_4_ = 0xffffffff;
                auVar98 = packssdw(auVar98 ^ auVar25,auVar98 ^ auVar25);
                if ((auVar98 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                  ptr_01[uVar37 + 7] =
                       (ushort)(iVar55 < iVar14) * auVar97._8_2_ |
                       (ushort)(iVar55 >= iVar14) * (short)iVar55;
                }
                auVar98 = pshufhw(auVar98,auVar81,0x84);
                auVar26._8_4_ = 0xffffffff;
                auVar26._0_8_ = 0xffffffffffffffff;
                auVar26._12_4_ = 0xffffffff;
                auVar98 = packssdw(auVar98 ^ auVar26,auVar98 ^ auVar26);
                if ((auVar98 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                  ptr_01[uVar37 + 8] =
                       (ushort)(iVar57 < iVar15) * auVar97._12_2_ |
                       (ushort)(iVar57 >= iVar15) * (short)iVar57;
                }
                uVar37 = uVar37 + 8;
                iVar33 = iVar33 + gap * -8;
                iVar36 = iVar36 + gap * 8;
              } while ((s2Len + 7U & 0xfffffff8) != uVar37);
              iVar33 = (int)uVar41;
              lVar35 = uVar41 * 0x10;
              uVar37 = 0;
              auVar27._4_4_ = uVar46;
              auVar27._0_4_ = uVar46;
              auVar27._8_4_ = uVar46;
              auVar27._12_4_ = uVar46;
              local_68 = auVar52._0_2_;
              uStack_66 = auVar52._2_2_;
              auVar52 = auVar27;
              uVar70 = local_68;
              uVar71 = uStack_66;
              uVar72 = local_68;
              uVar73 = uStack_66;
              uVar74 = local_68;
              uVar75 = uStack_66;
              uVar76 = local_68;
              uVar77 = uStack_66;
              do {
                ptr_02 = ptr;
                ptr = palVar31;
                uVar56 = ptr_02[iVar33 - 1][0];
                iVar36 = ppVar5->mapper[(byte)s2[uVar37]];
                auVar95._8_8_ = ptr_02[iVar33 - 1][1] << 0x10 | uVar56 >> 0x30;
                auVar95._0_8_ = uVar56 << 0x10 | (ulong)(ushort)ptr_01[uVar37];
                lVar34 = 0;
                auVar69 = auVar52;
                auVar96 = auVar27;
                do {
                  auVar52 = paddsw(auVar95,*(undefined1 (*) [16])
                                            ((long)pvVar4 + lVar34 + uVar41 * (long)iVar36 * 0x10));
                  auVar78 = *(undefined1 (*) [16])((long)*ptr_00 + lVar34);
                  sVar68 = auVar96._0_2_;
                  sVar61 = auVar78._0_2_;
                  uVar79 = (ushort)(sVar61 < sVar68) * sVar68 | (ushort)(sVar61 >= sVar68) * sVar61;
                  sVar7 = auVar96._2_2_;
                  sVar62 = auVar78._2_2_;
                  uVar83 = (ushort)(sVar62 < sVar7) * sVar7 | (ushort)(sVar62 >= sVar7) * sVar62;
                  sVar8 = auVar96._4_2_;
                  sVar63 = auVar78._4_2_;
                  uVar84 = (ushort)(sVar63 < sVar8) * sVar8 | (ushort)(sVar63 >= sVar8) * sVar63;
                  sVar9 = auVar96._6_2_;
                  sVar64 = auVar78._6_2_;
                  uVar85 = (ushort)(sVar64 < sVar9) * sVar9 | (ushort)(sVar64 >= sVar9) * sVar64;
                  sVar10 = auVar96._8_2_;
                  sVar65 = auVar78._8_2_;
                  uVar86 = (ushort)(sVar65 < sVar10) * sVar10 | (ushort)(sVar65 >= sVar10) * sVar65;
                  sVar11 = auVar96._10_2_;
                  sVar66 = auVar78._10_2_;
                  uVar87 = (ushort)(sVar66 < sVar11) * sVar11 | (ushort)(sVar66 >= sVar11) * sVar66;
                  sVar12 = auVar96._12_2_;
                  sVar89 = auVar78._12_2_;
                  sVar91 = auVar78._14_2_;
                  uVar88 = (ushort)(sVar89 < sVar12) * sVar12 | (ushort)(sVar89 >= sVar12) * sVar89;
                  sVar58 = auVar96._14_2_;
                  uVar90 = (ushort)(sVar91 < sVar58) * sVar58 | (ushort)(sVar91 >= sVar58) * sVar91;
                  sVar67 = auVar52._0_2_;
                  auVar82._0_2_ =
                       (ushort)((short)uVar79 < sVar67) * sVar67 |
                       ((short)uVar79 >= sVar67) * uVar79;
                  sVar67 = auVar52._2_2_;
                  auVar82._2_2_ =
                       (ushort)((short)uVar83 < sVar67) * sVar67 |
                       ((short)uVar83 >= sVar67) * uVar83;
                  sVar67 = auVar52._4_2_;
                  auVar82._4_2_ =
                       (ushort)((short)uVar84 < sVar67) * sVar67 |
                       ((short)uVar84 >= sVar67) * uVar84;
                  sVar67 = auVar52._6_2_;
                  auVar82._6_2_ =
                       (ushort)((short)uVar85 < sVar67) * sVar67 |
                       ((short)uVar85 >= sVar67) * uVar85;
                  sVar67 = auVar52._8_2_;
                  auVar82._8_2_ =
                       (ushort)((short)uVar86 < sVar67) * sVar67 |
                       ((short)uVar86 >= sVar67) * uVar86;
                  sVar67 = auVar52._10_2_;
                  auVar82._10_2_ =
                       (ushort)((short)uVar87 < sVar67) * sVar67 |
                       ((short)uVar87 >= sVar67) * uVar87;
                  sVar67 = auVar52._12_2_;
                  auVar82._12_2_ =
                       (ushort)((short)uVar88 < sVar67) * sVar67 |
                       ((short)uVar88 >= sVar67) * uVar88;
                  sVar67 = auVar52._14_2_;
                  auVar82._14_2_ =
                       (ushort)((short)uVar90 < sVar67) * sVar67 |
                       ((short)uVar90 >= sVar67) * uVar90;
                  *(undefined1 (*) [16])((long)*ptr + lVar34) = auVar82;
                  sVar67 = auVar69._0_2_;
                  auVar52._0_2_ =
                       (sVar67 < (short)auVar82._0_2_) * auVar82._0_2_ |
                       (ushort)(sVar67 >= (short)auVar82._0_2_) * sVar67;
                  sVar67 = auVar69._2_2_;
                  auVar52._2_2_ =
                       (sVar67 < (short)auVar82._2_2_) * auVar82._2_2_ |
                       (ushort)(sVar67 >= (short)auVar82._2_2_) * sVar67;
                  sVar67 = auVar69._4_2_;
                  auVar52._4_2_ =
                       (sVar67 < (short)auVar82._4_2_) * auVar82._4_2_ |
                       (ushort)(sVar67 >= (short)auVar82._4_2_) * sVar67;
                  sVar67 = auVar69._6_2_;
                  auVar52._6_2_ =
                       (sVar67 < (short)auVar82._6_2_) * auVar82._6_2_ |
                       (ushort)(sVar67 >= (short)auVar82._6_2_) * sVar67;
                  sVar67 = auVar69._8_2_;
                  auVar52._8_2_ =
                       (sVar67 < (short)auVar82._8_2_) * auVar82._8_2_ |
                       (ushort)(sVar67 >= (short)auVar82._8_2_) * sVar67;
                  sVar67 = auVar69._10_2_;
                  auVar52._10_2_ =
                       (sVar67 < (short)auVar82._10_2_) * auVar82._10_2_ |
                       (ushort)(sVar67 >= (short)auVar82._10_2_) * sVar67;
                  sVar67 = auVar69._12_2_;
                  sVar60 = auVar69._14_2_;
                  auVar52._12_2_ =
                       (sVar67 < (short)auVar82._12_2_) * auVar82._12_2_ |
                       (ushort)(sVar67 >= (short)auVar82._12_2_) * sVar67;
                  auVar52._14_2_ =
                       (sVar60 < (short)auVar82._14_2_) * auVar82._14_2_ |
                       (ushort)(sVar60 >= (short)auVar82._14_2_) * sVar60;
                  uVar70 = (ushort)(sVar61 < (short)uVar70) * sVar61 |
                           (sVar61 >= (short)uVar70) * uVar70;
                  uVar71 = (ushort)(sVar62 < (short)uVar71) * sVar62 |
                           (sVar62 >= (short)uVar71) * uVar71;
                  uVar72 = (ushort)(sVar63 < (short)uVar72) * sVar63 |
                           (sVar63 >= (short)uVar72) * uVar72;
                  uVar73 = (ushort)(sVar64 < (short)uVar73) * sVar64 |
                           (sVar64 >= (short)uVar73) * uVar73;
                  uVar74 = (ushort)(sVar65 < (short)uVar74) * sVar65 |
                           (sVar65 >= (short)uVar74) * uVar74;
                  uVar75 = (ushort)(sVar66 < (short)uVar75) * sVar66 |
                           (sVar66 >= (short)uVar75) * uVar75;
                  uVar76 = (ushort)(sVar89 < (short)uVar76) * sVar89 |
                           (sVar89 >= (short)uVar76) * uVar76;
                  uVar77 = (ushort)(sVar91 < (short)uVar77) * sVar91 |
                           (sVar91 >= (short)uVar77) * uVar77;
                  uVar70 = (ushort)(sVar68 < (short)uVar70) * sVar68 |
                           (sVar68 >= (short)uVar70) * uVar70;
                  uVar71 = (ushort)(sVar7 < (short)uVar71) * sVar7 |
                           (sVar7 >= (short)uVar71) * uVar71;
                  uVar72 = (ushort)(sVar8 < (short)uVar72) * sVar8 |
                           (sVar8 >= (short)uVar72) * uVar72;
                  uVar73 = (ushort)(sVar9 < (short)uVar73) * sVar9 |
                           (sVar9 >= (short)uVar73) * uVar73;
                  uVar74 = (ushort)(sVar10 < (short)uVar74) * sVar10 |
                           (sVar10 >= (short)uVar74) * uVar74;
                  uVar75 = (ushort)(sVar11 < (short)uVar75) * sVar11 |
                           (sVar11 >= (short)uVar75) * uVar75;
                  uVar76 = (ushort)(sVar12 < (short)uVar76) * sVar12 |
                           (sVar12 >= (short)uVar76) * uVar76;
                  uVar77 = (ushort)(sVar58 < (short)uVar77) * sVar58 |
                           (sVar58 >= (short)uVar77) * uVar77;
                  uVar70 = ((short)auVar82._0_2_ < (short)uVar70) * auVar82._0_2_ |
                           ((short)auVar82._0_2_ >= (short)uVar70) * uVar70;
                  uVar71 = ((short)auVar82._2_2_ < (short)uVar71) * auVar82._2_2_ |
                           ((short)auVar82._2_2_ >= (short)uVar71) * uVar71;
                  uVar72 = ((short)auVar82._4_2_ < (short)uVar72) * auVar82._4_2_ |
                           ((short)auVar82._4_2_ >= (short)uVar72) * uVar72;
                  uVar73 = ((short)auVar82._6_2_ < (short)uVar73) * auVar82._6_2_ |
                           ((short)auVar82._6_2_ >= (short)uVar73) * uVar73;
                  uVar74 = ((short)auVar82._8_2_ < (short)uVar74) * auVar82._8_2_ |
                           ((short)auVar82._8_2_ >= (short)uVar74) * uVar74;
                  uVar75 = ((short)auVar82._10_2_ < (short)uVar75) * auVar82._10_2_ |
                           ((short)auVar82._10_2_ >= (short)uVar75) * uVar75;
                  uVar76 = ((short)auVar82._12_2_ < (short)uVar76) * auVar82._12_2_ |
                           ((short)auVar82._12_2_ >= (short)uVar76) * uVar76;
                  uVar77 = ((short)auVar82._14_2_ < (short)uVar77) * auVar82._14_2_ |
                           ((short)auVar82._14_2_ >= (short)uVar77) * uVar77;
                  auVar97._4_4_ = uVar44;
                  auVar97._0_4_ = uVar44;
                  auVar97._8_4_ = uVar44;
                  auVar97._12_4_ = uVar44;
                  auVar95 = psubsw(auVar82,auVar97);
                  auVar17._4_4_ = uVar45;
                  auVar17._0_4_ = uVar45;
                  auVar17._8_4_ = uVar45;
                  auVar17._12_4_ = uVar45;
                  auVar69 = psubsw(auVar78,auVar17);
                  sVar68 = auVar95._0_2_;
                  sVar58 = auVar69._0_2_;
                  sVar67 = auVar95._2_2_;
                  sVar60 = auVar69._2_2_;
                  sVar7 = auVar95._4_2_;
                  sVar61 = auVar69._4_2_;
                  sVar8 = auVar95._6_2_;
                  sVar62 = auVar69._6_2_;
                  sVar9 = auVar95._8_2_;
                  sVar63 = auVar69._8_2_;
                  sVar10 = auVar95._10_2_;
                  sVar64 = auVar69._10_2_;
                  sVar11 = auVar95._12_2_;
                  sVar65 = auVar69._12_2_;
                  sVar66 = auVar69._14_2_;
                  sVar12 = auVar95._14_2_;
                  puVar1 = (ushort *)((long)*ptr_00 + lVar34);
                  *puVar1 = (ushort)(sVar58 < sVar68) * sVar68 | (ushort)(sVar58 >= sVar68) * sVar58
                  ;
                  puVar1[1] = (ushort)(sVar60 < sVar67) * sVar67 |
                              (ushort)(sVar60 >= sVar67) * sVar60;
                  puVar1[2] = (ushort)(sVar61 < sVar7) * sVar7 | (ushort)(sVar61 >= sVar7) * sVar61;
                  puVar1[3] = (ushort)(sVar62 < sVar8) * sVar8 | (ushort)(sVar62 >= sVar8) * sVar62;
                  puVar1[4] = (ushort)(sVar63 < sVar9) * sVar9 | (ushort)(sVar63 >= sVar9) * sVar63;
                  puVar1[5] = (ushort)(sVar64 < sVar10) * sVar10 |
                              (ushort)(sVar64 >= sVar10) * sVar64;
                  puVar1[6] = (ushort)(sVar65 < sVar11) * sVar11 |
                              (ushort)(sVar65 >= sVar11) * sVar65;
                  puVar1[7] = (ushort)(sVar66 < sVar12) * sVar12 |
                              (ushort)(sVar66 >= sVar12) * sVar66;
                  auVar18._4_4_ = uVar45;
                  auVar18._0_4_ = uVar45;
                  auVar18._8_4_ = uVar45;
                  auVar18._12_4_ = uVar45;
                  auVar69 = psubsw(auVar96,auVar18);
                  sVar58 = auVar69._0_2_;
                  auVar96._0_2_ =
                       (ushort)(sVar58 < sVar68) * sVar68 | (ushort)(sVar58 >= sVar68) * sVar58;
                  sVar68 = auVar69._2_2_;
                  auVar96._2_2_ =
                       (ushort)(sVar68 < sVar67) * sVar67 | (ushort)(sVar68 >= sVar67) * sVar68;
                  sVar68 = auVar69._4_2_;
                  auVar96._4_2_ =
                       (ushort)(sVar68 < sVar7) * sVar7 | (ushort)(sVar68 >= sVar7) * sVar68;
                  sVar68 = auVar69._6_2_;
                  auVar96._6_2_ =
                       (ushort)(sVar68 < sVar8) * sVar8 | (ushort)(sVar68 >= sVar8) * sVar68;
                  sVar68 = auVar69._8_2_;
                  auVar96._8_2_ =
                       (ushort)(sVar68 < sVar9) * sVar9 | (ushort)(sVar68 >= sVar9) * sVar68;
                  sVar68 = auVar69._10_2_;
                  auVar96._10_2_ =
                       (ushort)(sVar68 < sVar10) * sVar10 | (ushort)(sVar68 >= sVar10) * sVar68;
                  sVar68 = auVar69._12_2_;
                  sVar67 = auVar69._14_2_;
                  auVar96._12_2_ =
                       (ushort)(sVar68 < sVar11) * sVar11 | (ushort)(sVar68 >= sVar11) * sVar68;
                  auVar96._14_2_ =
                       (ushort)(sVar67 < sVar12) * sVar12 | (ushort)(sVar67 >= sVar12) * sVar67;
                  auVar95 = *(undefined1 (*) [16])((long)*ptr_02 + lVar34);
                  lVar34 = lVar34 + 0x10;
                  auVar69 = auVar52;
                } while (lVar35 != lVar34);
                iVar36 = 0;
                do {
                  uVar3 = ptr_01[uVar37 + 1] - open;
                  if (ptr_01[uVar37 + 1] - open < -0x7fff) {
                    uVar3 = 0xffff8000;
                  }
                  uVar56 = auVar96._0_8_;
                  auVar96._8_8_ = auVar96._8_8_ << 0x10 | uVar56 >> 0x30;
                  auVar96._0_8_ = uVar56 << 0x10 | (ulong)uVar3 & 0xffff;
                  lVar34 = 0;
                  auVar69 = auVar52;
                  do {
                    psVar2 = (short *)((long)*ptr + lVar34);
                    sVar67 = *psVar2;
                    sVar7 = psVar2[1];
                    sVar8 = psVar2[2];
                    sVar9 = psVar2[3];
                    sVar10 = psVar2[4];
                    sVar11 = psVar2[5];
                    sVar12 = psVar2[6];
                    sVar58 = psVar2[7];
                    sVar68 = auVar96._0_2_;
                    auVar53._0_2_ =
                         (ushort)(sVar67 < sVar68) * sVar68 | (ushort)(sVar67 >= sVar68) * sVar67;
                    sVar68 = auVar96._2_2_;
                    auVar53._2_2_ =
                         (ushort)(sVar7 < sVar68) * sVar68 | (ushort)(sVar7 >= sVar68) * sVar7;
                    sVar68 = auVar96._4_2_;
                    auVar53._4_2_ =
                         (ushort)(sVar8 < sVar68) * sVar68 | (ushort)(sVar8 >= sVar68) * sVar8;
                    sVar68 = auVar96._6_2_;
                    auVar53._6_2_ =
                         (ushort)(sVar9 < sVar68) * sVar68 | (ushort)(sVar9 >= sVar68) * sVar9;
                    sVar68 = auVar96._8_2_;
                    auVar53._8_2_ =
                         (ushort)(sVar10 < sVar68) * sVar68 | (ushort)(sVar10 >= sVar68) * sVar10;
                    sVar68 = auVar96._10_2_;
                    auVar53._10_2_ =
                         (ushort)(sVar11 < sVar68) * sVar68 | (ushort)(sVar11 >= sVar68) * sVar11;
                    sVar68 = auVar96._12_2_;
                    auVar53._12_2_ =
                         (ushort)(sVar12 < sVar68) * sVar68 | (ushort)(sVar12 >= sVar68) * sVar12;
                    sVar68 = auVar96._14_2_;
                    auVar53._14_2_ =
                         (ushort)(sVar58 < sVar68) * sVar68 | (ushort)(sVar58 >= sVar68) * sVar58;
                    *(undefined1 (*) [16])((long)*ptr + lVar34) = auVar53;
                    uVar70 = ((short)auVar53._0_2_ < (short)uVar70) * auVar53._0_2_ |
                             ((short)auVar53._0_2_ >= (short)uVar70) * uVar70;
                    uVar71 = ((short)auVar53._2_2_ < (short)uVar71) * auVar53._2_2_ |
                             ((short)auVar53._2_2_ >= (short)uVar71) * uVar71;
                    uVar72 = ((short)auVar53._4_2_ < (short)uVar72) * auVar53._4_2_ |
                             ((short)auVar53._4_2_ >= (short)uVar72) * uVar72;
                    uVar73 = ((short)auVar53._6_2_ < (short)uVar73) * auVar53._6_2_ |
                             ((short)auVar53._6_2_ >= (short)uVar73) * uVar73;
                    uVar74 = ((short)auVar53._8_2_ < (short)uVar74) * auVar53._8_2_ |
                             ((short)auVar53._8_2_ >= (short)uVar74) * uVar74;
                    uVar75 = ((short)auVar53._10_2_ < (short)uVar75) * auVar53._10_2_ |
                             ((short)auVar53._10_2_ >= (short)uVar75) * uVar75;
                    uVar76 = ((short)auVar53._12_2_ < (short)uVar76) * auVar53._12_2_ |
                             ((short)auVar53._12_2_ >= (short)uVar76) * uVar76;
                    uVar77 = ((short)auVar53._14_2_ < (short)uVar77) * auVar53._14_2_ |
                             ((short)auVar53._14_2_ >= (short)uVar77) * uVar77;
                    sVar68 = auVar69._0_2_;
                    auVar52._0_2_ =
                         (sVar68 < (short)auVar53._0_2_) * auVar53._0_2_ |
                         (ushort)(sVar68 >= (short)auVar53._0_2_) * sVar68;
                    sVar68 = auVar69._2_2_;
                    auVar52._2_2_ =
                         (sVar68 < (short)auVar53._2_2_) * auVar53._2_2_ |
                         (ushort)(sVar68 >= (short)auVar53._2_2_) * sVar68;
                    sVar68 = auVar69._4_2_;
                    auVar52._4_2_ =
                         (sVar68 < (short)auVar53._4_2_) * auVar53._4_2_ |
                         (ushort)(sVar68 >= (short)auVar53._4_2_) * sVar68;
                    sVar68 = auVar69._6_2_;
                    auVar52._6_2_ =
                         (sVar68 < (short)auVar53._6_2_) * auVar53._6_2_ |
                         (ushort)(sVar68 >= (short)auVar53._6_2_) * sVar68;
                    sVar68 = auVar69._8_2_;
                    auVar52._8_2_ =
                         (sVar68 < (short)auVar53._8_2_) * auVar53._8_2_ |
                         (ushort)(sVar68 >= (short)auVar53._8_2_) * sVar68;
                    sVar68 = auVar69._10_2_;
                    auVar52._10_2_ =
                         (sVar68 < (short)auVar53._10_2_) * auVar53._10_2_ |
                         (ushort)(sVar68 >= (short)auVar53._10_2_) * sVar68;
                    sVar68 = auVar69._12_2_;
                    sVar67 = auVar69._14_2_;
                    auVar52._12_2_ =
                         (sVar68 < (short)auVar53._12_2_) * auVar53._12_2_ |
                         (ushort)(sVar68 >= (short)auVar53._12_2_) * sVar68;
                    auVar52._14_2_ =
                         (sVar67 < (short)auVar53._14_2_) * auVar53._14_2_ |
                         (ushort)(sVar67 >= (short)auVar53._14_2_) * sVar67;
                    auVar16._4_4_ = uVar44;
                    auVar16._0_4_ = uVar44;
                    auVar16._8_4_ = uVar44;
                    auVar16._12_4_ = uVar44;
                    auVar69 = psubsw(auVar53,auVar16);
                    auVar19._4_4_ = uVar45;
                    auVar19._0_4_ = uVar45;
                    auVar19._8_4_ = uVar45;
                    auVar19._12_4_ = uVar45;
                    auVar96 = psubsw(auVar96,auVar19);
                    auVar59._0_2_ = -(ushort)(auVar69._0_2_ < auVar96._0_2_);
                    auVar59._2_2_ = -(ushort)(auVar69._2_2_ < auVar96._2_2_);
                    auVar59._4_2_ = -(ushort)(auVar69._4_2_ < auVar96._4_2_);
                    auVar59._6_2_ = -(ushort)(auVar69._6_2_ < auVar96._6_2_);
                    auVar59._8_2_ = -(ushort)(auVar69._8_2_ < auVar96._8_2_);
                    auVar59._10_2_ = -(ushort)(auVar69._10_2_ < auVar96._10_2_);
                    auVar59._12_2_ = -(ushort)(auVar69._12_2_ < auVar96._12_2_);
                    auVar59._14_2_ = -(ushort)(auVar69._14_2_ < auVar96._14_2_);
                    if ((((((((((((((((auVar59 >> 7 & (undefined1  [16])0x1) ==
                                      (undefined1  [16])0x0 &&
                                     (auVar59 >> 0xf & (undefined1  [16])0x1) ==
                                     (undefined1  [16])0x0) &&
                                    (auVar59 >> 0x17 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                                   (auVar59 >> 0x1f & (undefined1  [16])0x1) ==
                                   (undefined1  [16])0x0) &&
                                  (auVar59 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                  ) && (auVar59 >> 0x2f & (undefined1  [16])0x1) ==
                                       (undefined1  [16])0x0) &&
                                (auVar59 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                               && (auVar59 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                               ) && (auVar59 >> 0x47 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                             (auVar59 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar59 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar59 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar59 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar59 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar59._14_2_ >> 7 & 1) == 0) && (auVar59._14_2_ & 0x8000) == 0)
                    goto LAB_00711c70;
                    lVar34 = lVar34 + 0x10;
                    auVar69 = auVar52;
                  } while (lVar35 != lVar34);
                  iVar36 = iVar36 + 1;
                } while (iVar36 != 8);
LAB_00711c70:
                uVar56 = ptr[uVar50][1];
                if (iVar29 < 7) {
                  iVar36 = 0;
                  uVar49 = ptr[uVar50][0];
                  do {
                    uVar56 = uVar56 << 0x10 | uVar49 >> 0x30;
                    iVar36 = iVar36 + 1;
                    uVar49 = uVar49 << 0x10;
                  } while (iVar36 < 7 - iVar29);
                }
                ((ppVar30->field_4).rowcols)->score_row[uVar37] = (int)(short)(uVar56 >> 0x30);
                uVar37 = uVar37 + 1;
                palVar31 = ptr_02;
                if (uVar37 == (uint)s2Len) {
                  uVar37 = 0;
                  do {
                    psVar2 = (short *)((long)*ptr + uVar37 * 4);
                    sVar68 = psVar2[1];
                    sVar67 = psVar2[2];
                    sVar7 = psVar2[3];
                    sVar8 = psVar2[4];
                    sVar9 = psVar2[5];
                    sVar10 = psVar2[6];
                    sVar11 = psVar2[7];
                    piVar6 = ((ppVar30->field_4).rowcols)->score_col;
                    *(int *)((long)piVar6 + uVar37) = (int)*psVar2;
                    *(int *)((long)piVar6 + (uint)(iVar33 * 4) + uVar37) = (int)sVar68;
                    *(int *)((long)piVar6 + uVar41 * 8 + uVar37) = (int)sVar67;
                    *(int *)((long)piVar6 + (ulong)(uint)(iVar33 * 4) * 3 + uVar37) = (int)sVar7;
                    *(int *)((long)piVar6 + lVar35 + uVar37) = (int)sVar8;
                    *(int *)((long)piVar6 + (ulong)(uint)(iVar33 * 4) * 5 + uVar37) = (int)sVar9;
                    *(int *)((long)piVar6 + uVar41 * 0x18 + uVar37) = (int)sVar10;
                    *(int *)((long)piVar6 + uVar41 * 0x1c + uVar37) = (int)sVar11;
                    uVar37 = uVar37 + 4;
                  } while ((uint)(iVar33 * 4) != uVar37);
                  uVar41 = ptr[uVar50][1];
                  if (iVar29 < 7) {
                    iVar33 = 0;
                    uVar50 = ptr[uVar50][0];
                    do {
                      uVar41 = uVar41 << 0x10 | uVar50 >> 0x30;
                      iVar33 = iVar33 + 1;
                      uVar50 = uVar50 << 0x10;
                    } while (iVar33 < 7 - iVar29);
                  }
                  sVar68 = auVar51._0_2_;
                  auVar94._0_2_ = -(ushort)((short)uVar70 < sVar68);
                  sVar67 = auVar51._2_2_;
                  auVar94._2_2_ = -(ushort)((short)uVar71 < sVar67);
                  auVar94._4_2_ = -(ushort)((short)uVar72 < sVar68);
                  auVar94._6_2_ = -(ushort)((short)uVar73 < sVar67);
                  auVar94._8_2_ = -(ushort)((short)uVar74 < sVar68);
                  auVar94._10_2_ = -(ushort)((short)uVar75 < sVar67);
                  auVar94._12_2_ = -(ushort)((short)uVar76 < sVar68);
                  auVar94._14_2_ = -(ushort)((short)uVar77 < sVar67);
                  auVar51._0_2_ = -(ushort)((short)local_68 < (short)auVar52._0_2_);
                  auVar51._2_2_ = -(ushort)((short)uStack_66 < (short)auVar52._2_2_);
                  auVar51._4_2_ = -(ushort)((short)local_68 < (short)auVar52._4_2_);
                  auVar51._6_2_ = -(ushort)((short)uStack_66 < (short)auVar52._6_2_);
                  auVar51._8_2_ = -(ushort)((short)local_68 < (short)auVar52._8_2_);
                  auVar51._10_2_ = -(ushort)((short)uStack_66 < (short)auVar52._10_2_);
                  auVar51._12_2_ = -(ushort)((short)local_68 < (short)auVar52._12_2_);
                  auVar51._14_2_ = -(ushort)((short)uStack_66 < (short)auVar52._14_2_);
                  auVar51 = auVar51 | auVar94;
                  if ((((((((((((((((auVar51 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                   && (auVar51 >> 0xf & (undefined1  [16])0x1) ==
                                      (undefined1  [16])0x0) &&
                                  (auVar51 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                  ) && (auVar51 >> 0x1f & (undefined1  [16])0x1) ==
                                       (undefined1  [16])0x0) &&
                                (auVar51 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                               && (auVar51 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                               ) && (auVar51 >> 0x37 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                             (auVar51 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar51 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar51 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar51 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar51 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar51 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar51 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar51 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      -1 < auVar51[0xf]) {
                    sVar68 = (short)(uVar41 >> 0x30);
                  }
                  else {
                    *(byte *)&ppVar30->flag = (byte)ppVar30->flag | 0x40;
                    sVar68 = 0;
                    iVar32 = 0;
                    uVar38 = 0;
                  }
                  ppVar30->score = (int)sVar68;
                  ppVar30->end_query = uVar38;
                  ppVar30->end_ref = iVar32;
                  parasail_free(ptr_01);
                  parasail_free(ptr_00);
                  parasail_free(ptr_02);
                  parasail_free(ptr);
                  return ppVar30;
                }
              } while( true );
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict vProfile = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvE = NULL;
    int16_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    int16_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile16.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 8; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile = (__m128i*)profile->profile16.score;
    vGapO = _mm_set1_epi16(open);
    vGapE = _mm_set1_epi16(gap);
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_8;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m128i(16, segLen);
    pvHLoad  = parasail_memalign___m128i(16, segLen);
    pvE      = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int16_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvE) return NULL;
    if (!boundary) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_16_t h;
            __m128i_16_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
            }
            _mm_store_si128(&pvHStore[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT16_MIN ? INT16_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        /* Initialize F value to -inf.  Any errors to vH values will be
         * corrected in the Lazy_F loop.  */
        __m128i vF = vNegLimit;

        /* load final segment of pvHStore and shift left by 2 bytes */
        __m128i vH = _mm_slli_si128(pvHStore[segLen - 1], 2);

        /* Correct part of the vProfile */
        const __m128i* vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        __m128i* pv = pvHLoad;
        pvHLoad = pvHStore;
        pvHStore = pv;

        /* insert upper boundary condition */
        vH = _mm_insert_epi16(vH, boundary[j], 0);

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm_adds_epi16(vH, _mm_load_si128(vP + i));
            vE = _mm_load_si128(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm_max_epi16(vH, vE);
            vH = _mm_max_epi16(vH, vF);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vH);
            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vE);
            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vF);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif

            /* Update vE value. */
            vH = _mm_subs_epi16(vH, vGapO);
            vE = _mm_subs_epi16(vE, vGapE);
            vE = _mm_max_epi16(vE, vH);
            _mm_store_si128(pvE + i, vE);

            /* Update vF value. */
            vF = _mm_subs_epi16(vF, vGapE);
            vF = _mm_max_epi16(vF, vH);

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            int64_t tmp = boundary[j+1]-open;
            int16_t tmp2 = tmp < INT16_MIN ? INT16_MIN : tmp;
            vF = _mm_slli_si128(vF, 2);
            vF = _mm_insert_epi16(vF, tmp2, 0);
            for (i=0; i<segLen; ++i) {
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi16(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
                vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
                arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                vH = _mm_subs_epi16(vH, vGapO);
                vF = _mm_subs_epi16(vF, vGapE);
                if (! _mm_movemask_epi8(_mm_cmpgt_epi16(vF, vH))) goto end;
                /*vF = _mm_max_epi16(vF, vH);*/
            }
        }
end:
        {
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm_load_si128(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 2);
            }
            result->rowcols->score_row[j] = (int16_t) _mm_extract_epi16 (vH, 7);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvHStore+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* extract last value from the last column */
    {
        __m128i vH = _mm_load_si128(pvHStore + offset);
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128 (vH, 2);
        }
        score = (int16_t) _mm_extract_epi16 (vH, 7);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi16(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(boundary);
    parasail_free(pvE);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}